

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

unsigned_short __thiscall Am_Slot_Iterator::Length(Am_Slot_Iterator *this)

{
  Am_Object_Data *pAVar1;
  unsigned_short uVar2;
  Am_Slot_Iterator si;
  Am_Object AStack_28;
  Am_Slot_Iterator local_20;
  
  pAVar1 = (this->context).data;
  if ((pAVar1 == (Am_Object_Data *)0x0) || ((pAVar1->data).data == (char *)0x0)) {
    uVar2 = 0;
  }
  else {
    Am_Object::Am_Object(&AStack_28,&this->context);
    Am_Slot_Iterator(&local_20,&AStack_28);
    Am_Object::~Am_Object(&AStack_28);
    Start(&local_20);
    uVar2 = 0;
    while ((local_20.data)->curr_obj != (Am_Object_Data *)0x0) {
      uVar2 = uVar2 + 1;
      Next(&local_20);
    }
    ~Am_Slot_Iterator(&local_20);
  }
  return uVar2;
}

Assistant:

bool
Am_Object::Valid() const
{
  return (data != nullptr) && (data->data.data != nullptr);
}